

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O0

string * ktx::toString_abi_cxx11_(khr_df_model_e colorModel,khr_df_model_channels_e channelType)

{
  char *__s;
  uint in_EDX;
  undefined4 in_ESI;
  v10 *this;
  string *in_RDI;
  char *str;
  undefined1 in_stack_00000128 [16];
  undefined1 in_stack_00000138 [16];
  string *__a;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *local_f8 [2];
  byte local_e2;
  allocator<char> local_e1;
  char *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_a8;
  char *local_a0;
  size_t local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int> *local_90
  ;
  char *local_88;
  size_t sStack_80;
  char *local_70;
  char **local_68;
  undefined8 *local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
  **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  this = (v10 *)(ulong)in_EDX;
  __a = in_RDI;
  __s = (char *)dfdToStringChannelId(in_ESI);
  local_e2 = 0;
  local_e0 = __s;
  if (__s == (char *)0x0) {
    local_68 = local_f8;
    local_70 = "(0x{:01X})";
    local_18 = "(0x{:01X})";
    local_f8[0] = "(0x{:01X})";
    local_10 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x2af90d);
    local_8 = local_70;
    local_88 = local_f8[0];
    local_90 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int>
                *)&stack0xffffffffffffff04;
    local_60 = &local_88;
    local_a0 = local_f8[0];
    sStack_80 = local_98;
    local_58 = local_a0;
    sStack_50 = local_98;
    local_c8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int>
                            (local_90,this,(uint *)in_RDI);
    local_40 = &local_b0;
    local_48 = local_c8;
    local_28 = 2;
    local_b0 = 2;
    local_38 = local_48;
    local_30 = local_48;
    local_20 = local_40;
    local_a8 = local_48;
    ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_00000138,(format_args)in_stack_00000128);
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),__s,
               (allocator<char> *)__a);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  return __a;
}

Assistant:

[[nodiscard]] inline std::string toString(khr_df_model_e colorModel, khr_df_model_channels_e channelType) noexcept {
    const auto str = dfdToStringChannelId(colorModel, channelType);
    return str ? std::string(str) : fmt::format("(0x{:01X})", static_cast<uint32_t>(channelType));
}